

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9150::bypassOff(RTIMUMPU9150 *this)

{
  bool bVar1;
  uchar userControl;
  byte local_9;
  
  bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'j',
                            '\x01',&local_9,"Failed to read user_ctrl reg");
  if (bVar1) {
    local_9 = local_9 | 0x20;
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               'j','\x01',&local_9,"Failed to write user_ctrl reg");
    if (bVar1) {
      RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,0x32);
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr
                                 ,'7',0x80,"Failed to write int_pin_cfg reg");
      if (bVar1) {
        RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,0x32);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUMPU9150::bypassOff()
{
    unsigned char userControl;

    if (!m_settings->HALRead(m_slaveAddr, MPU9150_USER_CTRL, 1, &userControl, "Failed to read user_ctrl reg"))
        return false;

    userControl |= 0x20;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_USER_CTRL, 1, &userControl, "Failed to write user_ctrl reg"))
        return false;

    m_settings->delayMs(50);

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_INT_PIN_CFG, 0x80, "Failed to write int_pin_cfg reg"))
         return false;

    m_settings->delayMs(50);
    return true;
}